

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O2

void Cmd_listmaps(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined8 uVar1;
  level_info_t *plVar2;
  FString FVar3;
  int wadnum;
  char *in_RAX;
  MapData *this;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  FString local_38;
  
  lVar5 = 0;
  local_38.Chars = in_RAX;
  for (uVar6 = 0; plVar2 = wadlevelinfos.Array, uVar6 < wadlevelinfos.Count; uVar6 = uVar6 + 1) {
    this = P_OpenMapData(*(char **)((long)&((wadlevelinfos.Array)->MapName).Chars + lVar5),true);
    if (this != (MapData *)0x0) {
      uVar1 = *(undefined8 *)((long)&(plVar2->MapName).Chars + lVar5);
      level_info_t::LookupLevelName((level_info_t *)&stack0xffffffffffffffc8);
      FVar3.Chars = local_38.Chars;
      wadnum = FWadCollection::GetLumpFile(&Wads,this->lumpnum);
      pcVar4 = FWadCollection::GetWadName(&Wads,wadnum);
      Printf("%s: \'%s\' (%s)\n",uVar1,FVar3.Chars,pcVar4);
      FString::~FString(&stack0xffffffffffffffc8);
      MapData::~MapData(this);
      operator_delete(this,0xe8);
    }
    lVar5 = lVar5 + 0x1b0;
  }
  return;
}

Assistant:

CCMD(listmaps)
{
	for(unsigned i = 0; i < wadlevelinfos.Size(); i++)
	{
		level_info_t *info = &wadlevelinfos[i];
		MapData *map = P_OpenMapData(info->MapName, true);

		if (map != NULL)
		{
			Printf("%s: '%s' (%s)\n", info->MapName.GetChars(), info->LookupLevelName().GetChars(),
				Wads.GetWadName(Wads.GetLumpFile(map->lumpnum)));
			delete map;
		}
	}
}